

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_fix.cpp
# Opt level: O1

void Omega_h::grade_fix_adapt(Mesh *mesh,AdaptOpts *opts,Reals *target_metric,bool verbose)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Alloc *pAVar3;
  bool bVar4;
  bool bVar5;
  LO nmetrics;
  Int IVar6;
  ostream *poVar7;
  undefined7 in_register_00000009;
  long lVar8;
  char *pcVar9;
  Real RVar10;
  string local_88;
  double local_68;
  Read<double> local_60;
  Reals local_50;
  Reals local_40;
  
  if ((int)CONCAT71(in_register_00000009,verbose) == 0) {
    bVar4 = false;
  }
  else {
    bVar4 = can_print(mesh);
  }
  nmetrics = Mesh::nverts(mesh);
  local_40.write_.shared_alloc_.alloc = (target_metric->write_).shared_alloc_.alloc;
  if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
      local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_40.write_.shared_alloc_.alloc =
           (Alloc *)((local_40.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_40.write_.shared_alloc_.alloc)->use_count =
           (local_40.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_40.write_.shared_alloc_.direct_ptr = (target_metric->write_).shared_alloc_.direct_ptr;
  IVar6 = get_metrics_dim(nmetrics,&local_40);
  pAVar3 = local_40.write_.shared_alloc_.alloc;
  if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
      local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_40.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_40.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  if (bVar4 != false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Limiting target metric gradation...\n",0x24);
  }
  local_50.write_.shared_alloc_.alloc = (target_metric->write_).shared_alloc_.alloc;
  if (((ulong)local_50.write_.shared_alloc_.alloc & 7) == 0 &&
      local_50.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_50.write_.shared_alloc_.alloc =
           (Alloc *)((local_50.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_50.write_.shared_alloc_.alloc)->use_count =
           (local_50.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_50.write_.shared_alloc_.direct_ptr = (target_metric->write_).shared_alloc_.direct_ptr;
  limit_metric_gradation((Omega_h *)&local_88,mesh,&local_50,0.5,0.01,true);
  pAVar3 = (target_metric->write_).shared_alloc_.alloc;
  if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
    piVar1 = &pAVar3->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar3);
      operator_delete(pAVar3,0x48);
    }
  }
  pAVar3 = local_50.write_.shared_alloc_.alloc;
  (target_metric->write_).shared_alloc_.alloc = (Alloc *)local_88._M_dataplus._M_p;
  (target_metric->write_).shared_alloc_.direct_ptr = (void *)local_88._M_string_length;
  if ((((ulong)local_88._M_dataplus._M_p & 7) == 0 &&
       (Alloc *)local_88._M_dataplus._M_p != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    *(int *)(local_88._M_dataplus._M_p + 0x30) = *(int *)(local_88._M_dataplus._M_p + 0x30) + -1;
    (target_metric->write_).shared_alloc_.alloc =
         (Alloc *)(*(long *)local_88._M_dataplus._M_p * 8 + 1);
  }
  local_88._M_dataplus._M_p = (pointer)0x0;
  local_88._M_string_length = 0;
  if (((ulong)local_50.write_.shared_alloc_.alloc & 7) == 0 &&
      local_50.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_50.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_50.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  paVar2 = &local_88.field_2;
  local_88._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"target_metric","");
  Mesh::remove_tag(mesh,0,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  local_88._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"target_metric","");
  local_60.write_.shared_alloc_.alloc = (target_metric->write_).shared_alloc_.alloc;
  if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_60.write_.shared_alloc_.alloc =
           (Alloc *)((local_60.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_60.write_.shared_alloc_.alloc)->use_count =
           (local_60.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_60.write_.shared_alloc_.direct_ptr = (target_metric->write_).shared_alloc_.direct_ptr;
  Mesh::add_tag<double>(mesh,0,&local_88,((IVar6 + 1) * IVar6) / 2,&local_60,false);
  pAVar3 = local_60.write_.shared_alloc_.alloc;
  if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_60.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_60.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  local_88._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"metric","");
  bVar5 = Mesh::has_tag(mesh,0,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (bVar5) {
    if (bVar4 != false) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "Mesh already has \"metric\" on vertices, assuming that is current\n",0x40);
    }
  }
  else {
    if (bVar4 != false) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Deriving implied metric...\n",0x1b);
    }
    if (IVar6 == 1) {
      add_implied_isos_tag(mesh);
    }
    else {
      add_implied_metric_tag(mesh);
    }
  }
  RVar10 = Mesh::min_quality(mesh);
  if (bVar4 != false) {
    local_68 = RVar10;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Initial mesh has minimum quality ",0x21);
    std::ostream::_M_insert<double>(local_68);
    RVar10 = local_68;
  }
  if (opts->min_quality_allowed <= RVar10) {
    if (bVar4 == false) goto LAB_002c618b;
    pcVar9 = ", which is good\n";
    lVar8 = 0x10;
LAB_002c6140:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,lVar8);
  }
  else {
    if (bVar4 != false) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," < minimum acceptable quality ",0x1e);
      poVar7 = std::ostream::_M_insert<double>(opts->min_quality_allowed);
      local_88._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_88,1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "Omega_h will now attempt to repair the initial mesh quality.\n",0x3d);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"This could take some time...\n",0x1d);
      fix(mesh,opts,(uint)(IVar6 == 1),true);
      pcVar9 = "\nOmega_h is done repairing mesh quality!\n\n";
      lVar8 = 0x2a;
      goto LAB_002c6140;
    }
    fix(mesh,opts,(uint)(IVar6 == 1),true);
  }
  if (bVar4 != false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Adapting...\n",0xc);
  }
LAB_002c618b:
  while (bVar5 = approach_metric(mesh,opts,0.0001), bVar5) {
    adapt(mesh,opts);
  }
  if (bVar4 != false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nDone adapting!\n\n",0x11);
  }
  return;
}

Assistant:

void grade_fix_adapt(
    Mesh* mesh, AdaptOpts const& opts, Reals target_metric, bool verbose) {
  verbose = verbose && can_print(mesh);
  auto metric_dim = get_metrics_dim(mesh->nverts(), target_metric);
  if (verbose) std::cout << "Limiting target metric gradation...\n";
  target_metric = Omega_h::limit_metric_gradation(mesh, target_metric, 0.5);
  mesh->remove_tag(VERT, "target_metric");
  mesh->add_tag(VERT, "target_metric", symm_ncomps(metric_dim), target_metric);
  if (mesh->has_tag(0, "metric")) {
    if (verbose)
      std::cout << "Mesh already has \"metric\" on vertices, assuming that is "
                   "current\n";
  } else {
    if (verbose) std::cout << "Deriving implied metric...\n";
    if (metric_dim == 1) {
      Omega_h::add_implied_isos_tag(mesh);
    } else {
      Omega_h::add_implied_metric_tag(mesh);
    }
  }
  auto min_qual = mesh->min_quality();
  if (verbose) std::cout << "Initial mesh has minimum quality " << min_qual;
  if (min_qual < opts.min_quality_allowed) {
    if (verbose) {
      std::cout << " < minimum acceptable quality " << opts.min_quality_allowed
                << '\n';
      std::cout
          << "Omega_h will now attempt to repair the initial mesh quality.\n";
      std::cout << "This could take some time...\n";
    }
    auto isotropy =
        (metric_dim == 1 ? OMEGA_H_ISO_LENGTH : OMEGA_H_ANISOTROPIC);
    Omega_h::fix(mesh, opts, isotropy, /*verbose=*/true);
    if (verbose) std::cout << "\nOmega_h is done repairing mesh quality!\n\n";
  } else {
    if (verbose) std::cout << ", which is good\n";
  }
  if (verbose) std::cout << "Adapting...\n";
  while (Omega_h::approach_metric(mesh, opts)) {
    Omega_h::adapt(mesh, opts);
  }
  if (verbose) std::cout << "\nDone adapting!\n\n";
}